

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

uint8 * google::protobuf::internal::PrimitiveTypeHelper<18>::SerializeToArray
                  (void *ptr,uint8 *buffer)

{
  uint8 *puVar1;
  
  puVar1 = io::CodedOutputStream::WriteVarint64ToArray(*ptr >> 0x3f ^ *ptr * 2,buffer);
  return puVar1;
}

Assistant:

static uint8* SerializeToArray(const void* ptr, uint8* buffer) {
    return WireFormatLite::WriteSInt64NoTagToArray(Get<Type>(ptr), buffer);
  }